

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void test_to_number<unsigned_long_long>
               (char *str,unsigned_long_long wanted,bool error,_func_unsigned_long_long_char_ptr *fn
               )

{
  unsigned_long_long uVar1;
  ostream *poVar2;
  string msg;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  uVar1 = (*fn)(str);
  if (uVar1 == wanted) {
    poVar2 = std::operator<<((ostream *)&std::cout,str);
    poVar2 = std::operator<<(poVar2," to int: PASSED");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,str);
    poVar2 = std::operator<<(poVar2," to int failed; got ");
    poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void
test_to_number(char const* str, int_T wanted, bool error, int_T (*fn)(char const*))
{
    bool threw = false;
    bool worked = false;
    int_T result = 0;
    std::string msg;
    try {
        result = fn(str);
        worked = (wanted == result);
    } catch (std::runtime_error const& e) {
        threw = true;
        msg = e.what();
    }
    if (threw) {
        if (error) {
            std::cout << str << " to int threw (" << msg << "): PASSED" << std::endl;
        } else {
            std::cout << str << " to int threw but wanted " << wanted << std::endl;
        }
    } else {
        if (worked) {
            std::cout << str << " to int: PASSED" << std::endl;
        } else {
            std::cout << str << " to int failed; got " << result << std::endl;
        }
    }
}